

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetLinkDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  string *psVar1;
  cmLocalGenerator *this_01;
  bool bVar2;
  PolicyStatus PVar3;
  undefined7 extraout_var;
  string *psVar4;
  ostream *poVar5;
  string *psVar6;
  cmake *this_02;
  string *psVar7;
  PolicyID id;
  MessageType t;
  pointer pEVar8;
  __ireturn_type _Var9;
  allocator<char> local_365;
  undefined4 local_364;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_360;
  cmGeneratorTarget *local_358;
  cmListFileBacktrace *local_350;
  string usedDirectories;
  string local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  EvaluatedTargetPropertyEntries entries;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueDirectories;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniqueDirectories._M_h._M_buckets = &uniqueDirectories._M_h._M_single_bucket;
  uniqueDirectories._M_h._M_bucket_count = 1;
  uniqueDirectories._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueDirectories._M_h._M_element_count = 0;
  uniqueDirectories._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueDirectories._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueDirectories._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_360 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
              __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"LINK_DIRECTORIES",(allocator<char> *)&e);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_2c0,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_2c0);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&usedDirectories);
  cmMakefile::GetDefExpandList(this_00,(string *)&e,&debugProperties,false);
  std::__cxx11::string::~string((string *)&e);
  if (this->DebugLinkDirectoriesDone == false) {
    bVar2 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[17],_0>
                      (&debugProperties,(char (*) [17])0x66f96e);
    local_364 = (undefined4)CONCAT71(extraout_var,bVar2);
  }
  else {
    local_364 = 0;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugLinkDirectoriesDone = true;
  }
  anon_unknown.dwarf_1082924::EvaluateTargetPropertyEntries
            (&entries,this,config,language,&dagChecker,&this->LinkDirectoriesEntries);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"INTERFACE_LINK_DIRECTORIES",(allocator<char> *)&usedDirectories);
  PVar3 = GetPolicyStatusCMP0099(this);
  anon_unknown.dwarf_1082924::AddInterfaceEntries
            (this,config,(string *)&e,language,&dagChecker,&entries,Yes,(uint)(PVar3 == NEW));
  std::__cxx11::string::~string((string *)&e);
  pEVar8 = entries.Entries.
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_358 = this;
  do {
    if (pEVar8 == entries.Entries.
                  super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00344521:
      anon_unknown.dwarf_1082924::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
                (&entries);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugProperties);
      cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&uniqueDirectories._M_h);
      return (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_360;
    }
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(&pEVar8->LinkImplItem->super_cmLinkItem);
    usedDirectories._M_dataplus._M_p = (pointer)&usedDirectories.field_2;
    usedDirectories._M_string_length = 0;
    usedDirectories.field_2._M_local_buf[0] = '\0';
    psVar1 = (pEVar8->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_350 = &pEVar8->Backtrace;
    for (psVar7 = (pEVar8->Values).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1)
    {
      bVar2 = cmsys::SystemTools::FileIsFullPath(psVar7);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        if (psVar4->_M_string_length == 0) {
          PVar3 = GetPolicyStatusCMP0081(this);
          if (PVar3 == OLD) {
            bVar2 = true;
LAB_00344300:
            t = FATAL_ERROR;
          }
          else {
            if (PVar3 != WARN) {
              bVar2 = false;
              goto LAB_00344300;
            }
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_328,(cmPolicies *)0x51,id);
            poVar5 = std::operator<<((ostream *)&e,(string *)&local_328);
            std::operator<<(poVar5,"\n");
            std::__cxx11::string::~string((string *)&local_328);
            t = AUTHOR_WARNING;
            bVar2 = false;
          }
          poVar5 = std::operator<<((ostream *)&e,
                                   "Found relative path while evaluating link directories of \"");
          psVar6 = GetName_abi_cxx11_(local_358);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5,"\":\n  \"");
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          std::operator<<(poVar5,"\"\n");
          if (!bVar2) goto LAB_0034435d;
        }
        else {
          poVar5 = std::operator<<((ostream *)&e,"Target \"");
          poVar5 = std::operator<<(poVar5,(string *)psVar4);
          poVar5 = std::operator<<(poVar5,
                                   "\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \""
                                  );
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          std::operator<<(poVar5,"\"");
          t = FATAL_ERROR;
LAB_0034435d:
          this_01 = local_358->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this_01,t,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          if (t == FATAL_ERROR) {
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            std::__cxx11::string::~string((string *)&usedDirectories);
            goto LAB_00344521;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        this = local_358;
      }
      cmsys::SystemTools::ConvertToUnixSlashes(psVar7);
      _Var9 = std::__detail::
              _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&uniqueDirectories,psVar7);
      if (((undefined1  [16])_Var9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string&,cmListFileBacktrace&>(local_360,psVar7,local_350);
        if ((char)local_364 != '\0') {
          std::operator+(&local_328," * ",psVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                         &local_328,"\n");
          std::__cxx11::string::append((string *)&usedDirectories);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string((string *)&local_328);
        }
      }
    }
    if (usedDirectories._M_string_length != 0) {
      this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"Used link directories for target ",&local_365);
      psVar7 = GetName_abi_cxx11_(this);
      std::operator+(&local_280,&local_2a0,psVar7);
      std::operator+(&local_328,&local_280,":\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     &local_328,&usedDirectories);
      cmake::IssueMessage(this_02,LOG,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          local_350);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    std::__cxx11::string::~string((string *)&usedDirectories);
    pEVar8 = pEVar8 + 1;
  } while( true );
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetLinkDirectories(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueDirectories;

  cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_DIRECTORIES", nullptr,
                                             nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugDirectories = !this->DebugLinkDirectoriesDone &&
    cm::contains(debugProperties, "LINK_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugLinkDirectoriesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, language, &dagChecker, this->LinkDirectoriesEntries);

  AddInterfaceEntries(this, config, "INTERFACE_LINK_DIRECTORIES", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes,
                      this->GetPolicyStatusCMP0099() == cmPolicies::NEW
                        ? LinkInterfaceFor::Link
                        : LinkInterfaceFor::Usage);

  processLinkDirectories(this, entries, result, uniqueDirectories,
                         debugDirectories);

  return result;
}